

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgregoriancalendar.cpp
# Opt level: O3

int QGregorianCalendar::yearSharingWeekDays(QDate date)

{
  uint year;
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int *piVar6;
  long in_FS_OFFSET;
  QDate local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  year = QDate::year(&local_28);
  if ((int)year < 0x7b2) {
    uVar1 = (((int)year >> 0x1f) - year) + 2000;
    uVar5 = ((uVar1 / 400) * 400 - uVar1) + 0x960;
  }
  else {
    uVar1 = year;
    if (year < 0x960) goto LAB_0034e028;
    uVar5 = (year - 2000) % 400 + 2000;
  }
  uVar1 = 0x960;
  if (uVar5 != year) {
    uVar4 = uVar5 + ((uVar5 & 0xffff) / 100) * -100 & 0xffff;
    uVar1 = QDate::month(&local_28);
    if ((uVar1 == uVar4) || (uVar2 = QDate::day(&local_28), uVar1 = uVar5, uVar2 == uVar4)) {
      piVar6 = yearSharingWeekDays::usual;
      uVar1 = ((int)year < 1) + year;
      if ((uVar1 & 3) == 0) {
        uVar5 = uVar1 * -0x3d70a3d7 + 0x51eb850;
        piVar6 = yearSharingWeekDays::usual;
        if ((uVar5 >> 4 | uVar1 * -0x70000000) < 0xa3d70b) {
          piVar6 = yearSharingWeekDays::leaps;
        }
        if (0x28f5c28 < (uVar5 >> 2 | uVar1 * 0x40000000)) {
          piVar6 = yearSharingWeekDays::leaps;
        }
      }
      iVar3 = yearStartWeekDay(year);
      uVar1 = piVar6[(long)iVar3 + -1];
    }
  }
LAB_0034e028:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return uVar1;
  }
  __stack_chk_fail();
}

Assistant:

int QGregorianCalendar::yearSharingWeekDays(QDate date)
{
    // Returns a post-epoch year, no later than 2400, that has the same pattern
    // of week-days (in the proleptic Gregorian calendar) as the year in which
    // the given date falls. This will be the year in question if it's in the
    // given range. Otherwise, the returned year's last two (decimal) digits
    // won't coincide with the month number or day-of-month of the given date.
    // For positive years, except when necessary to avoid such a clash, the
    // returned year's last two digits shall coincide with those of the original
    // year.

    // Needed when formatting dates using system APIs with limited year ranges
    // and possibly only a two-digit year. (The need to be able to safely
    // replace the two-digit form of the returned year with a suitable form of
    // the true year, when they don't coincide, is why the last two digits are
    // treated specially.)

    static_assert((400 * 365 + 97) % 7 == 0);
    // A full 400-year cycle of the Gregorian calendar has 97 + 400 * 365 days;
    // as 365 is one more than a multiple of seven and 497 is a multiple of
    // seven, that full cycle is a whole number of weeks. So adding a multiple
    // of four hundred years should get us a result that meets our needs.

    const int year = date.year();
    int res = (year < 1970
               ? 2400 - (2000 - (year < 0 ? year + 1 : year)) % 400
               : year > 2399 ? 2000 + (year - 2000) % 400 : year);
    Q_ASSERT(res > 0);
    if (res != year) {
        const int lastTwo = res % 100;
        if (lastTwo == date.month() || lastTwo == date.day()) {
            Q_ASSERT(lastTwo && !(lastTwo & ~31));
            // Last two digits of these years are all > 31:
            static constexpr int usual[] = { 2198, 2199, 2098, 2099, 2399, 2298, 2299 };
            static constexpr int leaps[] = { 2396, 2284, 2296, 2184, 2196, 2084, 2096 };
            // Indexing is: first day of year's day-of-week, Monday = 0, one less
            // than Qt's, as it's simpler to subtract one than to s/7/0/.
            res = (leapTest(year) ? leaps : usual)[yearStartWeekDay(year) - 1];
        }
        Q_ASSERT(QDate(res, 1, 1).dayOfWeek() == QDate(year, 1, 1).dayOfWeek());
        Q_ASSERT(QDate(res, 12, 31).dayOfWeek() == QDate(year, 12, 31).dayOfWeek());
    }
    Q_ASSERT(res >= 1970 && res <= 2400);
    return res;
}